

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_lua.c
# Opt level: O0

int l_sqlite3_result_number(lua_State *L)

{
  sqlite3_context *psVar1;
  double rVal;
  lua_Number number;
  lua_State *L_local;
  
  rVal = (double)luaL_checknumber(L,2);
  if (((double)(int)rVal != rVal) || (NAN((double)(int)rVal) || NAN(rVal))) {
    psVar1 = (sqlite3_context *)checkudata(L,1);
    sqlite3_result_double(psVar1,rVal);
  }
  else {
    psVar1 = (sqlite3_context *)checkudata(L,1);
    sqlite3_result_int(psVar1,(int)rVal);
  }
  return 0;
}

Assistant:

FUNC( l_sqlite3_result_number )
{
  lua_Number number = checknumber(L, 2);
  
  if (IS_INT(number))
    sqlite3_result_int(checkcontext(L, 1), (int)number);
  else
    sqlite3_result_double(checkcontext(L, 1), (double)number);
  
  return 0;
}